

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::Lists::sort_f(Lists *this,DataList *dl)

{
  anon_class_16_2_7fa273f9 __comp;
  Object **ppOVar1;
  Ty<11UL> *this_00;
  FuncTableUnit *ftu;
  size_t i;
  FuncObject *pFVar2;
  iterator __first;
  iterator __last;
  ObjectPtr local_88;
  ObjectPtr r;
  List *list;
  FuncObject *rf;
  Object *local_60;
  undefined8 local_58;
  initializer_list<ICM::Object_*> local_50;
  lightlist<ICM::Object_*> local_40;
  size_t local_28;
  size_t id;
  FuncTableUnit *func;
  DataList *dl_local;
  
  func = (FuncTableUnit *)dl;
  dl_local = (DataList *)this;
  ppOVar1 = Common::lightlist<ICM::Object_*>::operator[](dl,1);
  this_00 = Object::get<11ul>(*ppOVar1);
  ftu = TypeBase::FunctionType::getData(this_00);
  local_60 = (Object *)0x21b750;
  local_58 = 0x21b750;
  local_50._M_array = &local_60;
  local_50._M_len = 2;
  id = (size_t)ftu;
  Common::lightlist<ICM::Object_*>::lightlist(&local_40,&local_50);
  i = getCallID(ftu,&local_40);
  Common::lightlist<ICM::Object_*>::~lightlist(&local_40);
  local_28 = i;
  pFVar2 = FuncTableUnit::operator[]((FuncTableUnit *)id,i);
  ppOVar1 = Common::lightlist<ICM::Object_*>::operator[]((lightlist<ICM::Object_*> *)func,0);
  r.data = (Object *)Object::get<17ul>(*ppOVar1);
  ObjectPtr::ObjectPtr(&local_88);
  __first = TypeBase::ListType::begin((ListType *)r.data);
  __last = TypeBase::ListType::end((ListType *)r.data);
  __comp.rf = pFVar2;
  __comp.r = &local_88;
  std::
  sort<__gnu_cxx::__normal_iterator<ICM::Object**,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>,ICM::DefFunc::Lists::sort_f(Common::lightlist<ICM::Object*>const&)::__0>
            ((__normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_>
              )__first._M_current,
             (__normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_>
              )__last._M_current,__comp);
  ppOVar1 = Common::lightlist<ICM::Object_*>::operator[]((lightlist<ICM::Object_*> *)func,0);
  ObjectPtr::ObjectPtr((ObjectPtr *)this,*ppOVar1);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr sort_f(const DataList &dl) {
				auto &func = dl[1]->get<T_Function>()->getData();
				// TODO
				size_t id = getCallID(func, DataList({ &Static.Zero, &Static.Zero }));
				const auto &rf = func[id];

				Types::List *list = dl[0]->get<T_List>();
				ObjectPtr r;
				std::sort(list->begin(), list->end(), [&](const ObjectPtr &a, const ObjectPtr &b) -> bool {
					r = rf.call(DataList{ a.get(), b.get() });
					bool rr = *r->get<T_Boolean>();
					return rr;
				});
				return ObjectPtr(dl[0]);
			}